

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

VertexBufferObject<float> * __thiscall
gl3cts::ClipDistance::FunctionalTest::prepareGeometry
          (FunctionalTest *this,Functions *gl,GLenum primitive_type)

{
  vector<float,_std::allocator<float>_> local_d0;
  undefined4 local_b4;
  value_type_conflict2 local_b0;
  value_type_conflict2 local_ac;
  value_type_conflict2 local_a8;
  value_type_conflict2 local_a4;
  value_type_conflict2 local_a0;
  value_type_conflict2 local_9c;
  value_type_conflict2 local_98;
  value_type_conflict2 local_94;
  value_type_conflict2 local_90;
  value_type_conflict2 local_8c;
  value_type_conflict2 local_88;
  value_type_conflict2 local_84;
  value_type_conflict2 local_80;
  value_type_conflict2 local_7c;
  value_type_conflict2 local_78;
  value_type_conflict2 local_74;
  value_type_conflict2 local_70;
  value_type_conflict2 local_6c;
  value_type_conflict2 local_68;
  value_type_conflict2 local_64;
  value_type_conflict2 local_60;
  value_type_conflict2 local_5c;
  value_type_conflict2 local_58 [5];
  value_type_conflict2 local_44;
  undefined1 local_40 [8];
  vector<float,_std::allocator<float>_> data;
  GLenum primitive_type_local;
  Functions *gl_local;
  FunctionalTest *this_local;
  
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = primitive_type;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_40);
  if (data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ == 0) {
    local_44 = 0.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_44);
    local_58[0] = 0.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,local_58);
    local_5c = 0.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_5c);
    local_60 = 1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_60);
  }
  else if (data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ == 1) {
    local_64 = 1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_64);
    local_68 = 1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_68);
    local_6c = 0.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_6c);
    local_70 = 1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_70);
    local_74 = -1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_74);
    local_78 = -1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_78);
    local_7c = 0.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_7c);
    local_80 = 1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_80);
  }
  else {
    if (data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ != 4) {
      this_local = (FunctionalTest *)0x0;
      goto LAB_011a0fb9;
    }
    local_84 = -1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_84);
    local_88 = -1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_88);
    local_8c = 0.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_8c);
    local_90 = 1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_90);
    local_94 = 0.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_94);
    local_98 = 1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_98);
    local_9c = 0.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_9c);
    local_a0 = 1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_a0);
    local_a4 = 1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_a4);
    local_a8 = -1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_a8);
    local_ac = 0.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_ac);
    local_b0 = 1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_40,&local_b0);
  }
  this_local = (FunctionalTest *)operator_new(0x30);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_d0,(vector<float,_std::allocator<float>_> *)local_40);
  Utility::VertexBufferObject<float>::VertexBufferObject
            ((VertexBufferObject<float> *)this_local,gl,0x8892,&local_d0);
  std::vector<float,_std::allocator<float>_>::~vector(&local_d0);
LAB_011a0fb9:
  local_b4 = 1;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_40);
  return (VertexBufferObject<float> *)this_local;
}

Assistant:

gl3cts::ClipDistance::Utility::VertexBufferObject<glw::GLfloat>* gl3cts::ClipDistance::FunctionalTest::prepareGeometry(
	const glw::Functions& gl, const glw::GLenum primitive_type)
{
	std::vector<glw::GLfloat> data;

	switch (primitive_type)
	{
	case GL_POINTS:
		data.push_back(0.0);
		data.push_back(0.0);
		data.push_back(0.0);
		data.push_back(1.0);
		break;
	case GL_LINES:
		data.push_back(1.0);
		data.push_back(1.0);
		data.push_back(0.0);
		data.push_back(1.0);
		data.push_back(-1.0);
		data.push_back(-1.0);
		data.push_back(0.0);
		data.push_back(1.0);
		break;
	case GL_TRIANGLES:
		data.push_back(-1.0);
		data.push_back(-1.0);
		data.push_back(0.0);
		data.push_back(1.0);
		data.push_back(0.0);
		data.push_back(1.0);
		data.push_back(0.0);
		data.push_back(1.0);
		data.push_back(1.0);
		data.push_back(-1.0);
		data.push_back(0.0);
		data.push_back(1.0);
		break;
	default:
		return NULL;
	}

	return new gl3cts::ClipDistance::Utility::VertexBufferObject<glw::GLfloat>(gl, GL_ARRAY_BUFFER, data);
}